

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.hpp
# Opt level: O3

void __thiscall
MAFSA::stack<MAFSA::daciuk<29>::node_*>::push(stack<MAFSA::daciuk<29>::node_*> *this,node *l)

{
  ulong uVar1;
  node **__src;
  node **__dest;
  size_t sVar2;
  
  uVar1 = this->reserved;
  sVar2 = this->current + 1;
  if (sVar2 < uVar1) {
    __dest = this->buffer;
  }
  else {
    __dest = (node **)operator_new__(-(ulong)((uVar1 & 0x7000000000000000) != 0) | uVar1 << 4);
    __src = this->buffer;
    memcpy(__dest,__src,uVar1 * 8);
    this->reserved = uVar1 * 2;
    if (__src != (node **)0x0) {
      operator_delete__(__src);
      sVar2 = this->current + 1;
    }
    this->buffer = __dest;
  }
  this->current = sVar2;
  __dest[sVar2] = l;
  return;
}

Assistant:

void push(_DATA l)
    {
        if (current + 1 >= reserved)
        {
            _DATA *_t = new _DATA [2 * reserved];
            memcpy(_t, buffer, reserved * sizeof(_DATA));

            reserved *= 2;
            delete [] buffer;

            buffer = _t;
        }

        buffer[++current] = l;
    }